

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

FieldDescriptor * __thiscall
google::protobuf::Descriptor::FindFieldByLowercaseName(Descriptor *this,ConstStringParam key)

{
  FileDescriptorTables *this_00;
  bool bVar1;
  FileDescriptor *pFVar2;
  StringPiece local_38;
  FieldDescriptor *local_28;
  FieldDescriptor *result;
  ConstStringParam key_local;
  Descriptor *this_local;
  
  result = (FieldDescriptor *)key;
  key_local = (ConstStringParam)this;
  pFVar2 = file(this);
  this_00 = *(FileDescriptorTables **)(pFVar2 + 0x80);
  stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>
            (&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)result);
  local_28 = FileDescriptorTables::FindFieldByLowercaseName(this_00,this,local_38);
  if ((local_28 != (FieldDescriptor *)0x0) &&
     (bVar1 = FieldDescriptor::is_extension(local_28), !bVar1)) {
    return local_28;
  }
  return (FieldDescriptor *)0x0;
}

Assistant:

const FieldDescriptor* Descriptor::FindFieldByLowercaseName(
    ConstStringParam key) const {
  const FieldDescriptor* result =
      file()->tables_->FindFieldByLowercaseName(this, key);
  if (result == nullptr || result->is_extension()) {
    return nullptr;
  } else {
    return result;
  }
}